

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall
QSslSocket::connectToHost
          (QSslSocket *this,QString *hostName,quint16 port,OpenMode openMode,
          NetworkLayerProtocol protocol)

{
  QSslSocketPrivate *this_00;
  qintptr qVar1;
  undefined4 in_ECX;
  undefined2 in_DX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  QAbstractSocket *in_RDI;
  NetworkLayerProtocol in_R8D;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QSslSocketPrivate *in_stack_00000050;
  OpenMode in_stack_000000dc;
  QString *in_stack_ffffffffffffffa8;
  QTcpSocket *networkProxy;
  QAbstractSocket *in_stack_ffffffffffffffb0;
  QAbstractSocket *this_01;
  QAbstractSocket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = in_RSI;
  local_18._12_4_ = in_ECX;
  this_00 = d_func((QSslSocket *)0x3a4730);
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.preferredNetworkLayerProtocol =
       in_R8D;
  if (((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f & 1) == 0) {
    QSslSocketPrivate::init(this_00,ctx);
  }
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  if (this_00->plainSocket == (QTcpSocket *)0x0) {
    local_18._8_4_ = local_18._12_4_;
    QSslSocketPrivate::createPlainSocket(in_stack_00000050,in_stack_000000dc);
  }
  QAbstractSocket::setProtocolTag(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  networkProxy = this_00->plainSocket;
  this_01 = &local_18;
  QAbstractSocket::proxy(in_RDI);
  QAbstractSocket::setProxy(this_01,(QNetworkProxy *)networkProxy);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x3a47e1);
  QIODevice::open((QFlags_conflict *)in_RDI);
  *(undefined4 *)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = 0;
  *(undefined4 *)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = 0;
  (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0xf8))
            (this_00->plainSocket,in_RSI,in_DX,local_18._12_4_,
             (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.
             preferredNetworkLayerProtocol);
  qVar1 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x110))();
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::connectToHost(const QString &hostName, quint16 port, OpenMode openMode, NetworkLayerProtocol protocol)
{
    Q_D(QSslSocket);
    d->preferredNetworkLayerProtocol = protocol;
    if (!d->initialized)
        d->init();
    d->initialized = false;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::connectToHost("
             << hostName << ',' << port << ',' << openMode << ')';
#endif
    if (!d->plainSocket) {
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "\tcreating internal plain socket";
#endif
        d->createPlainSocket(openMode);
    }
#ifndef QT_NO_NETWORKPROXY
    d->plainSocket->setProtocolTag(d->protocolTag);
    d->plainSocket->setProxy(proxy());
#endif
    QIODevice::open(openMode);
    d->readChannelCount = d->writeChannelCount = 0;
    d->plainSocket->connectToHost(hostName, port, openMode, d->preferredNetworkLayerProtocol);
    d->cachedSocketDescriptor = d->plainSocket->socketDescriptor();
}